

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O0

size_t __thiscall
slang::hash<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_void>::operator()
          (hash<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_void> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  bool bVar1;
  const_iterator __lhs;
  uint *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  size_t seed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28 [2];
  size_t local_18;
  
  local_18 = 0;
  local_28[0]._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (in_stack_ffffffffffffffc8);
  __lhs = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffc8 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         __gnu_cxx::
         __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
         ::operator*(local_28);
    hash_combine<unsigned_int>((size_t *)__lhs._M_current,(uint *)in_stack_ffffffffffffffc8);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(local_28);
  }
  return local_18;
}

Assistant:

size_t operator()(std::vector<T> const& v) const noexcept {
        size_t seed = 0;
        for (const auto& elem : v)
            hash_combine(seed, elem);
        return seed;
    }